

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<false,_false,_true>::visitDrop
          (SimplifyLocals<false,_false,_true> *this,Drop *curr)

{
  bool bVar1;
  LocalSet *this_00;
  LocalSet *set;
  Drop *curr_local;
  SimplifyLocals<false,_false,_true> *this_local;
  
  this_00 = Expression::dynCast<wasm::LocalSet>(curr->value);
  if (this_00 != (LocalSet *)0x0) {
    bVar1 = LocalSet::isTee(this_00);
    if (!bVar1) {
      __assert_fail("set->isTee()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x128,
                    "void wasm::SimplifyLocals<false, false>::visitDrop(Drop *) [allowTee = false, allowStructure = false, allowNesting = true]"
                   );
    }
    LocalSet::makeSet(this_00);
    Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
    ::replaceCurrent((Walker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                      *)&(this->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_true>,_void>_>
                     ,(Expression *)this_00);
  }
  return;
}

Assistant:

void visitDrop(Drop* curr) {
    // collapse drop-tee into set, which can occur if a get was sunk into a tee
    auto* set = curr->value->dynCast<LocalSet>();
    if (set) {
      assert(set->isTee());
      set->makeSet();
      this->replaceCurrent(set);
    }
  }